

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::enforceOk
          (BasicResult<Catch::Clara::ParseResultType> *this)

{
  BasicResult<Catch::Clara::ParseResultType> *this_local;
  
  if ((this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type ==
      LogicError) {
    __assert_fail("m_type != ResultType::LogicError",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x1244,
                  "virtual void Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::enforceOk() const [T = Catch::Clara::ParseResultType]"
                 );
  }
  if ((this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type !=
      RuntimeError) {
    if ((this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type != Ok)
    {
      abort();
    }
    return;
  }
  __assert_fail("m_type != ResultType::RuntimeError",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x1245,
                "virtual void Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::enforceOk() const [T = Catch::Clara::ParseResultType]"
               );
}

Assistant:

void enforceOk() const override {

                    // Errors shouldn't reach this point, but if they do
                    // the actual error message will be in m_errorMessage
                    assert( m_type != ResultType::LogicError );
                    assert( m_type != ResultType::RuntimeError );
                    if ( m_type != ResultType::Ok )
                        std::abort();
                }